

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_context *pCtx;
  u32 iVal;
  uchar *local_28;
  uchar *z;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  z = (uchar *)argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  local_28 = sqlite3_value_text(*argv);
  pCtx = psStack_10;
  if ((local_28 != (uchar *)0x0) && (*local_28 != '\0')) {
    iVal = sqlite3Utf8Read(&local_28);
    sqlite3_result_int(pCtx,iVal);
  }
  return;
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}